

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  FieldEntry *pFVar3;
  RepeatedField<unsigned_int> *this;
  ulong uVar4;
  uint *puVar5;
  char *pcVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  ParseContext *extraout_RDX;
  ulong uVar8;
  ParseContext *ctx_00;
  uint value;
  uint32_t *out;
  int iVar9;
  uint32_t next_tag;
  ParseContext *local_38;
  
  local_38 = ctx;
  pFVar3 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  this = RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)pFVar3->offset);
  aVar7.data = (long)&table->has_bits_offset + (ulong)table->aux_offset;
  uVar2 = *(uint *)(aVar7.data + (ulong)pFVar3->aux_idx * 8);
  iVar9 = (int)(short)uVar2;
  do {
    out = (uint32_t *)(long)*ptr;
    if ((long)out < 0) {
      uVar4 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar4 < 0) {
        aVar7.data = (long)ptr[2] << 0xe | 0x3fff;
        if ((long)aVar7 < 0) {
          uVar4 = uVar4 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar4 < 0) {
            aVar7.data = aVar7.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
            if ((long)aVar7.data < 0) {
              uVar4 = uVar4 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar4 < 0) {
                aVar7.data = aVar7.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                if ((long)aVar7 < 0) {
                  uVar4 = uVar4 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar4 < 0) {
                    uVar8 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    aVar7.data = aVar7.data & uVar8;
                    if ((long)aVar7 < 0) {
                      pcVar6 = ptr + 10;
                      bVar1 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar8 >> 8),bVar1);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') goto LAB_0026d0d5;
                        if ((bVar1 & 1) == 0) {
                          aVar7.data = aVar7.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      pcVar6 = ptr + 9;
                    }
                  }
                  else {
                    pcVar6 = ptr + 8;
                  }
                }
                else {
                  pcVar6 = ptr + 7;
                }
              }
              else {
                pcVar6 = ptr + 6;
              }
            }
            else {
              pcVar6 = ptr + 5;
            }
          }
          else {
            pcVar6 = ptr + 4;
          }
        }
        else {
          pcVar6 = ptr + 3;
        }
        uVar4 = uVar4 & aVar7.data;
      }
      else {
        pcVar6 = ptr + 2;
      }
      out = (uint32_t *)((ulong)out & uVar4);
    }
    else {
      pcVar6 = ptr + 1;
    }
    value = (uint)out;
    if (((int)value < iVar9) || ((int)((uVar2 >> 0x10) + iVar9) <= (int)value)) {
      pcVar6 = MpUnknownEnumFallback(msg,ptr,local_38,data,table,hasbits);
      return pcVar6;
    }
    RepeatedField<unsigned_int>::Add(this,value);
    if ((local_38->super_EpsCopyInputStream).limit_end_ <= pcVar6) break;
    out = &next_tag;
    ptr = ReadTag(pcVar6,out,0);
    ctx_00 = extraout_RDX;
    if (ptr == (char *)0x0) {
LAB_0026d0d5:
      pcVar6 = Error(msg,(char *)out,ctx_00,(TcFieldData)aVar7,table,hasbits);
      return pcVar6;
    }
  } while (next_tag == data.field_0._0_4_);
  if ((ulong)table->has_bits_offset != 0) {
    puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar5 = *puVar5 | (uint)hasbits;
  }
  return pcVar6;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}